

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  _Bool _Var1;
  time_t tVar2;
  Curl_llist_node *n;
  altsvc *paVar3;
  Curl_llist_node *pCVar4;
  
  tVar2 = time((time_t *)0x0);
  n = Curl_llist_head(&asi->list);
  do {
    while( true ) {
      if (n == (Curl_llist_node *)0x0) {
        return false;
      }
      paVar3 = (altsvc *)Curl_node_elem(n);
      pCVar4 = Curl_node_next(n);
      if (tVar2 <= paVar3->expires) break;
      Curl_node_remove(n);
      (*Curl_cfree)((paVar3->src).host);
      (*Curl_cfree)((paVar3->dst).host);
      (*Curl_cfree)(paVar3);
      n = pCVar4;
    }
    n = pCVar4;
  } while (((((paVar3->src).alpnid != srcalpnid) ||
            (_Var1 = hostcompare(srchost,(paVar3->src).host), !_Var1)) ||
           ((uint)(paVar3->src).port != srcport)) ||
          (((paVar3->dst).alpnid & versions) == ALPN_none));
  *dstentry = paVar3;
  return true;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = Curl_llist_head(&asi->list); e; e = n) {
    struct altsvc *as = Curl_node_elem(e);
    n = Curl_node_next(e);
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_node_remove(e);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       hostcompare(srchost, as->src.host) &&
       (as->src.port == srcport) &&
       (versions & (int)as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}